

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

string * __thiscall
upb::generator::(anonymous_namespace)::ToCIdent_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view str)

{
  size_type in_R9;
  string_view s;
  FixedMapping replacements;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_a0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  pStack_80;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  pStack_60;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_40;
  undefined8 local_38;
  _anonymous_namespace_ *local_30;
  size_t local_28;
  _anonymous_namespace_ *local_20;
  string_view str_local;
  
  local_28 = str._M_len;
  local_30 = this;
  local_20 = this;
  str_local._M_len = local_28;
  str_local._M_str = (char *)__return_storage_ptr__;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_a0,(char (*) [2])0x5f6d2f,(char (*) [2])0x6a9d85);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&pStack_80,(char (*) [2])0x66e48c,(char (*) [2])0x6a9d85);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&pStack_60,(char (*) [2])0x6c6e49,(char (*) [2])0x6a9d85);
  local_40 = &local_a0;
  local_38 = 3;
  s._M_str = (char *)local_40;
  s._M_len = local_28;
  replacements._M_len = in_R9;
  replacements._M_array = (iterator)0x3;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)local_30,s,replacements);
  return __return_storage_ptr__;
}

Assistant:

std::string ToCIdent(absl::string_view str) {
  return absl::StrReplaceAll(str, {{".", "_"}, {"/", "_"}, {"-", "_"}});
}